

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

int __thiscall
cmCTestBuildHandler::RunMakeCommand
          (cmCTestBuildHandler *this,string *command,int *retVal,char *dir,int timeout,ostream *ofs,
          Encoding encoding)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  reference ppcVar6;
  cmsysProcess *cp_00;
  char **command_00;
  ostream *poVar7;
  size_t sVar8;
  ulong uVar9;
  void *pvVar10;
  char *__str;
  mapped_type *pmVar11;
  reference ppcVar12;
  string local_14d0 [32];
  undefined1 local_14b0 [8];
  ostringstream cmCTestLog_msg_8;
  cmAlphaNum local_1338;
  cmAlphaNum local_1308;
  string local_12d8;
  undefined1 local_12b8 [8];
  cmCTestBuildErrorWarning errorwarning_1;
  undefined1 local_11e8 [8];
  ostringstream cmCTestLog_msg_7;
  string local_1070 [32];
  undefined1 local_1050 [8];
  ostringstream cmCTestLog_msg_6;
  cmAlphaNum local_ed8;
  cmAlphaNum local_ea8;
  string local_e78;
  undefined1 local_e58 [8];
  cmCTestBuildErrorWarning errorwarning;
  key_type local_da0;
  undefined1 local_d80 [8];
  cmCTestLaunchReporter reporter;
  char *fname;
  unsigned_long i;
  unsigned_long n;
  Directory local_b20;
  Directory launchDir;
  string local_b10 [7];
  bool launcherXMLFound;
  undefined1 local_af0 [8];
  ostringstream cmCTestLog_msg_5;
  string local_970 [4];
  int result;
  undefined1 local_950 [8];
  ostringstream cmCTestLog_msg_4;
  string local_7d8;
  string local_7b8;
  int local_798;
  int local_794;
  int cc;
  int res;
  undefined1 local_770 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_5f8 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_5d0;
  int length;
  char *data;
  size_type tick_len;
  size_type tick;
  cmsysProcess *cp;
  LaunchHelper launchHelper;
  ostringstream local_580 [8];
  ostringstream cmCTestLog_msg_2;
  string local_408 [32];
  undefined1 local_3e8 [8];
  ostringstream cmCTestLog_msg_1;
  char *arg_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1_1;
  undefined1 local_230 [8];
  ostringstream cmCTestLog_msg;
  value_type local_b8;
  value_type local_b0;
  reference local_a8;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_78 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostream *ofs_local;
  int timeout_local;
  char *dir_local;
  int *retVal_local;
  string *command_local;
  cmCTestBuildHandler *this_local;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ofs;
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,command);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
  if (bVar2) {
    this_local._4_4_ = 0;
    argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78,sVar4 + 1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), bVar2) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      local_b0 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78,&local_b0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    local_b8 = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78,&local_b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
    std::operator<<((ostream *)local_230,"Run command:");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x311,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&__range1_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
    __end1_1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
    arg_1 = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                               *)&arg_1), bVar2) {
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end1_1);
      pcVar5 = *ppcVar6;
      if (pcVar5 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
      poVar7 = std::operator<<((ostream *)local_3e8," \"");
      poVar7 = std::operator<<(poVar7,pcVar5);
      std::operator<<(poVar7,"\"");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x317,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_408);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end1_1);
    }
    std::__cxx11::ostringstream::ostringstream(local_580);
    std::ostream::operator<<(local_580,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x31a,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&launchHelper.CTest);
    std::__cxx11::ostringstream::~ostringstream(local_580);
    LaunchHelper::LaunchHelper((LaunchHelper *)&cp,this);
    cp_00 = cmsysProcess_New();
    tick = (size_type)cp_00;
    command_00 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
    cmsysProcess_SetCommand(cp_00,command_00);
    cmsysProcess_SetWorkingDirectory((cmsysProcess *)tick,dir);
    cmsysProcess_SetOption((cmsysProcess *)tick,0,1);
    cmsysProcess_SetTimeout((cmsysProcess *)tick,(double)timeout);
    cmsysProcess_Execute((cmsysProcess *)tick);
    tick_len = 0;
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
    std::__cxx11::string::string((string *)local_5f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
    poVar7 = std::operator<<((ostream *)local_770,"   Each symbol represents ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x400);
    poVar7 = std::operator<<(poVar7," bytes of output.");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pcVar5 = "   \'!\' represents an error and \'*\' a warning.\n";
    if ((this->UseCTestLaunch & 1U) != 0) {
      pcVar5 = "";
    }
    poVar7 = std::operator<<(poVar7,pcVar5);
    poVar7 = std::operator<<(poVar7,"    ");
    std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x338,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&cc);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
    std::deque<char,_std::allocator<char>_>::clear(&this->BuildProcessingQueue);
    this->OutputLineCounter = 0;
    std::
    vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
    ::clear(&this->ErrorsAndWarnings);
    this->TotalErrors = 0;
    this->TotalWarnings = 0;
    this->BuildOutputLogSize = 0;
    this->LastTickChar = '.';
    this->WarningQuotaReached = false;
    this->ErrorQuotaReached = false;
    while (local_794 = cmsysProcess_WaitForData
                                 ((cmsysProcess *)tick,&stack0xfffffffffffffa30,
                                  (int *)(strdata.field_2._M_local_buf + 0xc),(double *)0x0),
          local_794 != 0) {
      for (local_798 = 0; local_798 < (int)strdata.field_2._12_4_; local_798 = local_798 + 1) {
        if (pcStack_5d0[local_798] == '\0') {
          pcStack_5d0[local_798] = '\n';
        }
      }
      if (local_794 == 3) {
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_5d0,
                   (long)(int)strdata.field_2._12_4_,(string *)local_5f8,1);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        sVar8 = std::__cxx11::string::size();
        ProcessBuffer(this,pcVar5,sVar8,&tick_len,0x400,
                      (ostream *)
                      args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      &this->BuildProcessingErrorQueue);
      }
      else {
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_5d0,
                   (long)(int)strdata.field_2._12_4_,(string *)local_5f8,2);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        sVar8 = std::__cxx11::string::size();
        ProcessBuffer(this,pcVar5,sVar8,&tick_len,0x400,
                      (ostream *)
                      args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->BuildProcessingQueue
                     );
      }
    }
    std::__cxx11::string::string((string *)&local_7b8);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_7b8,
               (string *)local_5f8,1);
    std::__cxx11::string::~string((string *)&local_7b8);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      sVar8 = std::__cxx11::string::size();
      ProcessBuffer(this,pcVar5,sVar8,&tick_len,0x400,
                    (ostream *)
                    args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    &this->BuildProcessingErrorQueue);
    }
    std::__cxx11::string::string((string *)&local_7d8);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_7d8,
               (string *)local_5f8,2);
    std::__cxx11::string::~string((string *)&local_7d8);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      sVar8 = std::__cxx11::string::size();
      ProcessBuffer(this,pcVar5,sVar8,&tick_len,0x400,
                    (ostream *)
                    args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->BuildProcessingQueue);
    }
    ProcessBuffer(this,(char *)0x0,0,&tick_len,0x400,
                  (ostream *)
                  args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->BuildProcessingQueue);
    ProcessBuffer(this,(char *)0x0,0,&tick_len,0x400,
                  (ostream *)
                  args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  &this->BuildProcessingErrorQueue);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_950);
    poVar7 = std::operator<<((ostream *)local_950," Size of output: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->BuildOutputLogSize + 0x200 >> 10);
    poVar7 = std::operator<<(poVar7,"K");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x36e,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_970);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_950);
    cmsysProcess_WaitForExit((cmsysProcess *)tick,(double *)0x0);
    this_local._4_4_ = cmsysProcess_GetState((cmsysProcess *)tick);
    if (this_local._4_4_ == 4) {
      if (retVal != (int *)0x0) {
        iVar3 = cmsysProcess_GetExitValue((cmsysProcess *)tick);
        *retVal = iVar3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_af0);
        poVar7 = std::operator<<((ostream *)local_af0,"Command exited with the value: ");
        pvVar10 = (void *)std::ostream::operator<<(poVar7,*retVal);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x37a,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_b10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_af0);
        if (*retVal != 0) {
          if ((this->UseCTestLaunch & 1U) == 0) {
            cmCTestBuildErrorWarning::cmCTestBuildErrorWarning
                      ((cmCTestBuildErrorWarning *)local_e58);
            errorwarning.SourceFileTail.field_2._8_4_ = 0;
            local_e58._4_4_ = 1;
            cmAlphaNum::cmAlphaNum(&local_ea8,"*** WARNING non-zero return value in ctest from: ");
            ppcVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78,0)
            ;
            cmAlphaNum::cmAlphaNum(&local_ed8,*ppcVar12);
            cmStrCat<>(&local_e78,&local_ea8,&local_ed8);
            std::__cxx11::string::operator=((string *)&errorwarning,(string *)&local_e78);
            std::__cxx11::string::~string((string *)&local_e78);
            std::__cxx11::string::clear();
            std::__cxx11::string::clear();
            local_e58[0] = false;
            std::
            vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
            ::push_back(&this->ErrorsAndWarnings,(value_type *)local_e58);
            this->TotalWarnings = this->TotalWarnings + 1;
            cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning
                      ((cmCTestBuildErrorWarning *)local_e58);
          }
          else {
            launchDir.Internal._7_1_ = 0;
            cmsys::Directory::Directory(&local_b20);
            cmsys::Directory::Load(&local_b20,&this->CTestLaunchDir,(string *)0x0);
            pcVar5 = (char *)cmsys::Directory::GetNumberOfFiles(&local_b20);
            for (fname = (char *)0x0; fname < pcVar5; fname = fname + 1) {
              __str = cmsys::Directory::GetFile(&local_b20,(unsigned_long)fname);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&reporter.SourceDir.field_2 + 8),__str);
              bVar2 = cmHasLiteralSuffix<5ul>(stack0xfffffffffffff4b0,(char (*) [5])0xd1405b);
              if (bVar2) {
                launchDir.Internal._7_1_ = 1;
                break;
              }
            }
            if ((launchDir.Internal._7_1_ & 1) == 0) {
              cmCTestLaunchReporter::cmCTestLaunchReporter((cmCTestLaunchReporter *)local_d80);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&reporter.CWD.field_2 + 8),
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_58);
              cmCTestLaunchReporter::ComputeFileNames((cmCTestLaunchReporter *)local_d80);
              reporter.Process._0_4_ = *retVal;
              reporter._312_8_ = tick;
              std::ostream::flush();
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_da0,"Build",
                         (allocator<char> *)(errorwarning.PostContext.field_2._M_local_buf + 0xf));
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&(this->super_cmCTestGenericHandler).LogFileNames,&local_da0);
              std::__cxx11::string::operator=
                        ((string *)(reporter.LogDir.field_2._M_local_buf + 8),(string *)pmVar11);
              std::__cxx11::string::~string((string *)&local_da0);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(errorwarning.PostContext.field_2._M_local_buf + 0xf));
              std::__cxx11::string::operator+=
                        ((string *)(reporter.LogDir.field_2._M_local_buf + 8),".tmp");
              cmCTestLaunchReporter::WriteXML((cmCTestLaunchReporter *)local_d80);
              cmCTestLaunchReporter::~cmCTestLaunchReporter((cmCTestLaunchReporter *)local_d80);
            }
            cmsys::Directory::~Directory(&local_b20);
          }
        }
      }
    }
    else if (this_local._4_4_ == 2) {
      if (retVal != (int *)0x0) {
        iVar3 = cmsysProcess_GetExitException((cmsysProcess *)tick);
        *retVal = iVar3;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1050);
        poVar7 = std::operator<<((ostream *)local_1050,"There was an exception: ");
        pvVar10 = (void *)std::ostream::operator<<(poVar7,*retVal);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x3ac,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_1070);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1050);
      }
    }
    else if (this_local._4_4_ == 5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11e8);
      poVar7 = std::operator<<((ostream *)local_11e8,"There was a timeout");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x3b0,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)(errorwarning_1.PostContext.field_2._M_local_buf + 8))
      ;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11e8);
    }
    else if (this_local._4_4_ == 1) {
      cmCTestBuildErrorWarning::cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_12b8);
      errorwarning_1.SourceFileTail.field_2._8_4_ = 0;
      local_12b8._4_4_ = 1;
      cmAlphaNum::cmAlphaNum(&local_1308,"*** ERROR executing: ");
      pcVar5 = cmsysProcess_GetErrorString((cmsysProcess *)tick);
      cmAlphaNum::cmAlphaNum(&local_1338,pcVar5);
      cmStrCat<>(&local_12d8,&local_1308,&local_1338);
      std::__cxx11::string::operator=((string *)&errorwarning_1,(string *)&local_12d8);
      std::__cxx11::string::~string((string *)&local_12d8);
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      local_12b8[0] = true;
      std::
      vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ::push_back(&this->ErrorsAndWarnings,(value_type *)local_12b8);
      this->TotalErrors = this->TotalErrors + 1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_14b0);
      poVar7 = std::operator<<((ostream *)local_14b0,"There was an error: ");
      pcVar5 = cmsysProcess_GetErrorString((cmsysProcess *)tick);
      poVar7 = std::operator<<(poVar7,pcVar5);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x3bf,pcVar5,false);
      std::__cxx11::string::~string(local_14d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_14b0);
      cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_12b8);
    }
    cmsysProcess_Delete((cmsysProcess *)tick);
    argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_5f8);
    LaunchHelper::~LaunchHelper((LaunchHelper *)&cp);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_78);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildHandler::RunMakeCommand(const std::string& command,
                                        int* retVal, const char* dir,
                                        int timeout, std::ostream& ofs,
                                        Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    argv.push_back(arg.c_str());
  }
  argv.push_back(nullptr);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Run command:", this->Quiet);
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " \"" << arg << "\"", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                     this->Quiet);

  // Optionally use make rule launchers to record errors and warnings.
  LaunchHelper launchHelper(this);
  static_cast<void>(launchHelper);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  const std::string::size_type tick_len = 1024;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestOptionalLog(
    this->CTest, HANDLER_PROGRESS_OUTPUT,
    "   Each symbol represents "
      << tick_len << " bytes of output." << std::endl
      << (this->UseCTestLaunch
            ? ""
            : "   '!' represents an error and '*' a warning.\n")
      << "    " << std::flush,
    this->Quiet);

  // Initialize building structures
  this->BuildProcessingQueue.clear();
  this->OutputLineCounter = 0;
  this->ErrorsAndWarnings.clear();
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->BuildOutputLogSize = 0;
  this->LastTickChar = '.';
  this->WarningQuotaReached = false;
  this->ErrorQuotaReached = false;

  // For every chunk of data
  int res;
  while ((res = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Replace '\0' with '\n', since '\0' does not really make sense. This is
    // for Visual Studio output
    for (int cc = 0; cc < length; ++cc) {
      if (data[cc] == 0) {
        data[cc] = '\n';
      }
    }

    // Process the chunk of data
    if (res == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 1);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingErrorQueue);
    } else {
      processOutput.DecodeText(data, length, strdata, 2);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingQueue);
    }
  }
  processOutput.DecodeText(std::string(), strdata, 1);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingErrorQueue);
  }
  processOutput.DecodeText(std::string(), strdata, 2);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingQueue);
  }

  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingQueue);
  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingErrorQueue);
  cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                     " Size of output: "
                       << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                       << std::endl,
                     this->Quiet);

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Command exited with the value: " << *retVal
                                                           << std::endl,
                         this->Quiet);
      // if a non zero return value
      if (*retVal) {
        // If there was an error running command, report that on the
        // dashboard.
        if (this->UseCTestLaunch) {
          // For launchers, do not record this top-level error if other
          // more granular build errors have already been captured.
          bool launcherXMLFound = false;
          cmsys::Directory launchDir;
          launchDir.Load(this->CTestLaunchDir);
          unsigned long n = launchDir.GetNumberOfFiles();
          for (unsigned long i = 0; i < n; ++i) {
            const char* fname = launchDir.GetFile(i);
            if (cmHasLiteralSuffix(fname, ".xml")) {
              launcherXMLFound = true;
              break;
            }
          }
          if (!launcherXMLFound) {
            cmCTestLaunchReporter reporter;
            reporter.RealArgs = args;
            reporter.ComputeFileNames();
            reporter.ExitCode = *retVal;
            reporter.Process = cp;
            // Use temporary BuildLog file to populate this error for CDash.
            ofs.flush();
            reporter.LogOut = this->LogFileNames["Build"];
            reporter.LogOut += ".tmp";
            reporter.WriteXML();
          }
        } else {
          cmCTestBuildErrorWarning errorwarning;
          errorwarning.LineNumber = 0;
          errorwarning.LogLine = 1;
          errorwarning.Text = cmStrCat(
            "*** WARNING non-zero return value in ctest from: ", argv[0]);
          errorwarning.PreContext.clear();
          errorwarning.PostContext.clear();
          errorwarning.Error = false;
          this->ErrorsAndWarnings.push_back(std::move(errorwarning));
          this->TotalWarnings++;
        }
      }
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitException(cp);
      cmCTestOptionalLog(this->CTest, WARNING,
                         "There was an exception: " << *retVal << std::endl,
                         this->Quiet);
    }
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "There was a timeout" << std::endl, this->Quiet);
  } else if (result == cmsysProcess_State_Error) {
    // If there was an error running command, report that on the dashboard.
    cmCTestBuildErrorWarning errorwarning;
    errorwarning.LineNumber = 0;
    errorwarning.LogLine = 1;
    errorwarning.Text =
      cmStrCat("*** ERROR executing: ", cmsysProcess_GetErrorString(cp));
    errorwarning.PreContext.clear();
    errorwarning.PostContext.clear();
    errorwarning.Error = true;
    this->ErrorsAndWarnings.push_back(std::move(errorwarning));
    this->TotalErrors++;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);
  return result;
}